

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.cpp
# Opt level: O1

uint8_t __thiscall GmmLib::GmmResourceInfoCommon::Is64KBPageSuitable(GmmResourceInfoCommon *this)

{
  uint32_t uVar1;
  anon_struct_8_44_94931171_for_Info aVar2;
  anon_struct_8_45_9b07292e_for_Gpu aVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  
  uVar8 = (this->AuxSurf).Size + (this->Surf).Size + (this->AuxSecSurf).Size;
  aVar2 = (this->Surf).Flags.Info;
  if (((((ulong)aVar2 & 0x10000000020) == 0) &&
      (aVar3 = (this->Surf).Flags.Gpu, ((ulong)aVar2 & 0x4000) == 0 && ((ulong)aVar3 & 1) == 0)) &&
     (((aVar3._0_4_ & 0x3000000) != 0x1000000 ||
      (iVar4 = (*this->_vptr_GmmResourceInfoCommon[0x1e])(this),
      (*(byte *)(CONCAT44(extraout_var_05,iVar4) + 0x30) & 2) != 0)))) {
    uVar6 = 0;
  }
  else {
    uVar6 = 1;
  }
  iVar4 = (*this->_vptr_GmmResourceInfoCommon[0x1e])(this);
  uVar5 = SUB84((this->Surf).Flags.Info,0);
  if ((*(byte *)(CONCAT44(extraout_var,iVar4) + 0x1e) & 0x20) == 0) {
    if ((((uVar5 >> 0x15 & 1) != 0) && ((uVar8 & 0xffff) != 0)) ||
       (((uVar5 >> 0x15 & 1) == 0 &&
        (iVar4 = (*this->_vptr_GmmResourceInfoCommon[0x1e])(this),
        (((ulong)*(uint *)(CONCAT44(extraout_var_04,iVar4) + 0x35e8) + 100) * uVar8) / 100 <
        (uVar8 + 0xffff & 0xffffffffffff0000))))) {
      uVar6 = 1;
    }
  }
  else {
    iVar4 = (*this->_vptr_GmmResourceInfoCommon[0x1e])(this);
    uVar9 = *(uint *)&(this->Surf).Flags.Info >> 0x15;
    uVar7 = 0;
    if ((*(uint *)(CONCAT44(extraout_var_00,iVar4) + 0x1c) >> 0x17 & 1) == 0) {
      uVar9 = 0;
    }
    iVar4 = (*this->_vptr_GmmResourceInfoCommon[0x1e])(this);
    if (((*(byte *)(CONCAT44(extraout_var_01,iVar4) + 0x1e) & 0x80) != 0) ||
       (((this->Surf).Flags.Info.field_0x3 & 1) != 0)) {
      iVar4 = (*this->_vptr_GmmResourceInfoCommon[0x1e])(this);
      uVar7 = (uint)((((ulong)*(uint *)(CONCAT44(extraout_var_02,iVar4) + 0x35e8) + 100) * uVar8) /
                     100 < (uVar8 + 0xffff & 0xffffffffffff0000));
    }
    uVar6 = uVar9 | (byte)((byte)uVar6 | (uVar5 & 0x80800000) == 0x80000000) | uVar7;
  }
  iVar4 = (*this->_vptr_GmmResourceInfoCommon[0x1e])(this);
  if (((*(byte *)(CONCAT44(extraout_var_03,iVar4) + 0x1e) & 1) != 0) && ((uVar6 & 1) == 0)) {
    uVar1 = (this->Surf).Alignment.BaseAlignment;
    if ((short)uVar1 == 0) {
      return '\x01';
    }
    uVar6 = uVar1 << 0x14 | uVar1 - 0x1000 >> 0xc;
    if (uVar6 < 8) {
      return (uint8_t)(0x100000001000101 >> ((byte)(uVar6 << 3) & 0x3f));
    }
  }
  return '\0';
}

Assistant:

uint8_t GMM_STDCALL GmmLib::GmmResourceInfoCommon::Is64KBPageSuitable()
{
    bool Ignore64KBPadding = false;
    //!!!! DO NOT USE GetSizeSurface() as it returns the padded size and not natural size.
    GMM_GFX_SIZE_T Size = Surf.Size + AuxSurf.Size + AuxSecSurf.Size;

    __GMM_ASSERT(Size);

    // All ESM resources and VirtuaPadding are exempt from 64KB paging
    if(Surf.Flags.Info.ExistingSysMem ||
       Surf.Flags.Info.XAdapter ||
       Surf.Flags.Gpu.CameraCapture ||
       Surf.Flags.Info.KernelModeMapped ||
       (Surf.Flags.Gpu.S3d && !Surf.Flags.Gpu.S3dDx &&
        !GetGmmLibContext()->GetSkuTable().FtrDisplayEngineS3d)
#if(LHDM)
       || (Surf.Flags.Info.AllowVirtualPadding &&
           ExistingSysMem.hParentAllocation)
#endif
       )
    {
        Ignore64KBPadding = true;
    }

    if(GetGmmLibContext()->GetSkuTable().FtrLocalMemory)
     {
        Ignore64KBPadding |= (Surf.Flags.Info.Shared && !Surf.Flags.Info.NotLockable);
        Ignore64KBPadding |= ((GetGmmLibContext()->GetSkuTable().FtrLocalMemoryAllows4KB) && Surf.Flags.Info.NoOptimizationPadding);
        Ignore64KBPadding |= ((GetGmmLibContext()->GetSkuTable().FtrLocalMemoryAllows4KB || Surf.Flags.Info.NonLocalOnly) && (((Size * (100 + (GMM_GFX_SIZE_T)GetGmmLibContext()->GetAllowedPaddingFor64KbPagesPercentage())) / 100) < GFX_ALIGN(Size, GMM_KBYTE(64))));
    }
    else
    {
        // The final padded size cannot be larger then a set percentage of the original size
        if((Surf.Flags.Info.NoOptimizationPadding && !GFX_IS_ALIGNED(Size, GMM_KBYTE(64))) /*Surface is not 64kb aligned*/ ||
           (!Surf.Flags.Info.NoOptimizationPadding && (((Size * (100 + (GMM_GFX_SIZE_T)GetGmmLibContext()->GetAllowedPaddingFor64KbPagesPercentage())) / 100) < GFX_ALIGN(Size, GMM_KBYTE(64)))) /*10% padding TBC */)
        {
            Ignore64KBPadding |= true;
        }
    }

    // If 64KB paging is enabled pad out the resource to 64KB alignment
    if(GetGmmLibContext()->GetSkuTable().FtrWddm2_1_64kbPages &&
       // Ignore the padding for the above VirtualPadding or ESM cases
       (!Ignore64KBPadding) &&
       // Resource must be 64KB aligned
       (GFX_IS_ALIGNED(Surf.Alignment.BaseAlignment, GMM_KBYTE(64)) ||
        // Or must be aligned to a factor of 64KB
        (Surf.Alignment.BaseAlignment == GMM_KBYTE(32)) ||
        (Surf.Alignment.BaseAlignment == GMM_KBYTE(16)) ||
        (Surf.Alignment.BaseAlignment == GMM_KBYTE(8)) ||
        (Surf.Alignment.BaseAlignment == GMM_KBYTE(4))))
    {
        return 1;
    }

    return 0;
}